

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

bool __thiscall LTFlightData::TryDeriveGrndStatus(LTFlightData *this,positionTy *pos)

{
  double dVar1;
  bool bVar2;
  posFlagsTy pVar3;
  dataRefsLT dVar4;
  byte unaff_BPL;
  double dVar5;
  unique_lock<std::recursive_mutex> lock;
  
  lock._M_device = &this->dataAccessMutex;
  bVar2 = std::recursive_mutex::try_lock(lock._M_device);
  lock._M_owns = bVar2;
  if (bVar2) {
    dVar5 = ::YProbe_at_m(pos,&this->probeRef);
    if (NAN(dVar5)) {
      unaff_BPL = 0;
    }
    else {
      pVar3 = pos->f;
      if (((ushort)pVar3 & 0x300) != 0x200) {
        dVar1 = pos->_alt;
        dVar4 = GetCurrChannel(this);
        pVar3 = pos->f;
        if (dVar1 < *(double *)
                     (&DAT_00218bd0 + (ulong)(dVar4 == DR_CHANNEL_REAL_TRAFFIC_ONLINE) * 8) + dVar5)
        {
          pVar3 = (posFlagsTy)((ushort)pVar3 & 0xfcff | 0x200);
          pos->f = pVar3;
        }
      }
      if (((ushort)pVar3 & 0x300) == 0x200) {
        pos->_alt = dVar5 + -0.5;
      }
      else {
        pos->f = (posFlagsTy)((ushort)pVar3 & 0xfcff | 0x100);
      }
      unaff_BPL = 1;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  if (!bVar2) {
    unaff_BPL = 0;
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool LTFlightData::TryDeriveGrndStatus (positionTy& pos)
{
    try {
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock );
        if ( lock )
        {
            // what's the terrain altitude at that pos?
            double terrainAlt = YProbe_at_m(pos);
            if (std::isnan(terrainAlt))
                return false;
            
            // Now 2 options:
            // If position already says itself: I'm on the ground, then keep it like that
            // Otherwise decide based on altitude _if_ it's on the ground
            if (!pos.IsOnGnd() &&
                // say it's on the ground if below terrain+10m (or 20m in case of RealTraffic)
                pos.alt_m() < terrainAlt + (GetCurrChannel() == DR_CHANNEL_REAL_TRAFFIC_ONLINE ? FD_GND_AGL_EXT : FD_GND_AGL))
                pos.f.onGrnd = GND_ON;

            // if it was or now is on the ground correct the altitue to terrain altitude
            // (very slightly below to be sure to actually touch down even after rounding effects)
            if (pos.IsOnGnd())
                pos.alt_m() = terrainAlt - MDL_CLOSE_TO_GND;
            else
                // make sure it's either GND_ON or GND_OFF, nothing lese
                pos.f.onGrnd = GND_OFF;

            // successfully determined a status
            return true;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    
    // Either didn't get the lock or some caught error
    return false;
}